

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

void __thiscall RenX::Server::setPrefix(Server *this,string_view prefix)

{
  allocator<char> local_41;
  undefined1 local_40 [8];
  string tagged_prefix;
  Server *this_local;
  string_view prefix_local;
  
  prefix_local._M_len = (size_t)prefix._M_str;
  this_local = (Server *)prefix._M_len;
  tagged_prefix.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_40,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_41);
  std::allocator<char>::~allocator(&local_41);
  sanitizeTags((string *)local_40);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_IRCPrefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void RenX::Server::setPrefix(std::string_view prefix) {
	// TODO: pass in std::string here instead
	std::string tagged_prefix = static_cast<std::string>(prefix);
	RenX::sanitizeTags(tagged_prefix);
	m_IRCPrefix = tagged_prefix;
}